

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynFor * ParseFor(ParseContext *ctx)

{
  Lexeme *begin;
  int iVar1;
  SynVariableDefinitions *pSVar2;
  SynBase *this;
  undefined4 extraout_var;
  SynBlock *pSVar3;
  SynBase *this_00;
  undefined4 extraout_var_00;
  SynFor *this_01;
  undefined4 extraout_var_01;
  
  begin = ctx->currentLexeme;
  if (begin->type != lex_for) {
    return (SynFor *)0x0;
  }
  ctx->currentLexeme = begin + 1;
  anon_unknown.dwarf_15703::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'for\'");
  if (ctx->currentLexeme->type == lex_ofigure) {
    pSVar2 = (SynVariableDefinitions *)ParseBlock(ctx);
  }
  else {
    pSVar2 = ParseVariableDefinitions(ctx,false);
    if (pSVar2 != (SynVariableDefinitions *)0x0) goto LAB_00119d01;
    pSVar2 = (SynVariableDefinitions *)ParseAssignment(ctx);
    if (pSVar2 == (SynVariableDefinitions *)0x0) {
      if (ctx->currentLexeme->type == lex_semicolon) {
        ctx->currentLexeme = ctx->currentLexeme + 1;
        pSVar2 = (SynVariableDefinitions *)0x0;
      }
      else {
        pSVar2 = (SynVariableDefinitions *)0x0;
        anon_unknown.dwarf_15703::Report
                  (ctx,ctx->currentLexeme,"ERROR: \';\' not found after initializer in \'for\'");
      }
      goto LAB_00119d01;
    }
  }
  anon_unknown.dwarf_15703::CheckConsume
            (ctx,lex_semicolon,"ERROR: \';\' not found after initializer in \'for\'");
LAB_00119d01:
  this = ParseAssignment(ctx);
  if (this == (SynBase *)0x0) {
    anon_unknown.dwarf_15703::Report
              (ctx,ctx->currentLexeme,"ERROR: condition not found in \'for\' statement");
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])();
    this = (SynBase *)CONCAT44(extraout_var,iVar1);
    SynBase::SynBase(this,0,ctx->currentLexeme,ctx->currentLexeme);
    this->_vptr_SynBase = (_func_int **)&PTR__SynBase_002471e8;
  }
  anon_unknown.dwarf_15703::CheckConsume
            (ctx,lex_semicolon,"ERROR: \';\' not found after condition in \'for\'");
  if (ctx->currentLexeme->type == lex_ofigure) {
    pSVar3 = ParseBlock(ctx);
  }
  else {
    pSVar3 = (SynBlock *)ParseAssignment(ctx);
  }
  anon_unknown.dwarf_15703::CheckConsume
            (ctx,lex_cparen,"ERROR: \')\' not found after \'for\' statement");
  this_00 = ParseExpression(ctx);
  if (this_00 == (SynBase *)0x0) {
    anon_unknown.dwarf_15703::Report
              (ctx,ctx->currentLexeme,"ERROR: body not found after \'for\' header");
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])();
    this_00 = (SynBase *)CONCAT44(extraout_var_00,iVar1);
    SynBase::SynBase(this_00,0,ctx->currentLexeme,ctx->currentLexeme);
    this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_002471e8;
  }
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
  this_01 = (SynFor *)CONCAT44(extraout_var_01,iVar1);
  if (ctx->firstLexeme < ctx->currentLexeme) {
    SynBase::SynBase((SynBase *)this_01,0x28,begin,ctx->currentLexeme + -1);
    (this_01->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_00247bf8;
    this_01->initializer = &pSVar2->super_SynBase;
    this_01->condition = this;
    this_01->increment = &pSVar3->super_SynBase;
    this_01->body = this_00;
    return this_01;
  }
  __assert_fail("currentLexeme > firstLexeme",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                ,0x19c,"Lexeme *ParseContext::Previous()");
}

Assistant:

SynFor* ParseFor(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_for))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: '(' not found after 'for'");

		SynBase *initializer = NULL;

		if(ctx.At(lex_ofigure))
		{
			initializer = ParseBlock(ctx);

			CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after initializer in 'for'");
		}
		else if(SynBase *node = ParseVariableDefinitions(ctx, false))
		{
			initializer = node;
		}
		else if(SynBase *node = ParseAssignment(ctx))
		{
			initializer = node;

			CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after initializer in 'for'");
		}
		else if(!ctx.Consume(lex_semicolon))
		{
			Report(ctx, ctx.Current(), "ERROR: ';' not found after initializer in 'for'");
		}

		SynBase *condition = ParseAssignment(ctx);

		if(!condition)
		{
			Report(ctx, ctx.Current(), "ERROR: condition not found in 'for' statement");

			condition = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after condition in 'for'");

		SynBase *increment = NULL;

		if(ctx.At(lex_ofigure))
			increment = ParseBlock(ctx);
		else if(SynBase *node = ParseAssignment(ctx))
			increment = node;

		CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after 'for' statement");

		SynBase *body = ParseExpression(ctx);

		if(!body)
		{
			Report(ctx, ctx.Current(), "ERROR: body not found after 'for' header");

			body = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		return new (ctx.get<SynFor>()) SynFor(start, ctx.Previous(), initializer, condition, increment, body);
	}

	return NULL;
}